

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode_blocks(lzh_stream *strm,wchar_t last)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  huffman_conflict *hf;
  int in_ESI;
  lzh_stream *in_RDI;
  wchar_t li;
  uchar *d;
  uchar *s;
  wchar_t l;
  wchar_t p;
  wchar_t state;
  wchar_t pt_max_bits;
  wchar_t lt_max_bits;
  wchar_t w_size;
  wchar_t w_mask;
  wchar_t w_pos;
  wchar_t copy_pos;
  wchar_t copy_len;
  wchar_t c;
  wchar_t blocks_avail;
  uchar *pt_bitlen;
  uchar *lt_bitlen;
  uchar *w_buff;
  huffman_conflict *pt;
  huffman_conflict *lt;
  lzh_br bre;
  lzh_dec *ds;
  undefined4 in_stack_ffffffffffffff60;
  wchar_t in_stack_ffffffffffffff64;
  lzh_stream *in_stack_ffffffffffffff68;
  wchar_t local_88;
  wchar_t local_80;
  wchar_t local_6c;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t local_60;
  wchar_t local_5c;
  lzh_br local_30;
  lzh_dec *local_20;
  int local_14;
  lzh_stream *local_10;
  
  local_20 = in_RDI->ds;
  local_30.cache_buffer = (local_20->br).cache_buffer;
  local_30.cache_avail = (local_20->br).cache_avail;
  local_30._12_4_ = *(undefined4 *)&(local_20->br).field_0xc;
  puVar5 = local_20->w_buff;
  puVar6 = (local_20->lt).bitlen;
  puVar7 = (local_20->pt).bitlen;
  local_5c = local_20->blocks_avail;
  local_64 = local_20->copy_len;
  local_68 = local_20->copy_pos;
  local_6c = local_20->w_pos;
  wVar1 = local_20->w_mask;
  wVar2 = local_20->w_size;
  wVar3 = (local_20->lt).max_bits;
  wVar4 = (local_20->pt).max_bits;
  local_80 = local_20->state;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if ((L'\0' < local_20->w_remaining) &&
     (wVar8 = lzh_copy_from_window
                        (in_stack_ffffffffffffff68,
                         (lzh_dec *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
     wVar8 == L'\0')) {
LAB_00140c3d:
    (local_20->br).cache_buffer = local_30.cache_buffer;
    (local_20->br).cache_avail = local_30.cache_avail;
    *(undefined4 *)&(local_20->br).field_0xc = local_30._12_4_;
    local_20->blocks_avail = local_5c;
    local_20->state = local_80;
    local_20->w_pos = local_6c;
    return L'\0';
  }
switchD_0014065c_default:
  hf = (huffman_conflict *)(ulong)(uint)(local_80 + L'\xfffffff7');
  switch(hf) {
  case (huffman_conflict *)0x0:
    while( true ) {
      if (local_5c == L'\0') {
        local_20->state = L'\0';
        (local_20->br).cache_buffer = local_30.cache_buffer;
        (local_20->br).cache_avail = local_30.cache_avail;
        *(undefined4 *)&(local_20->br).field_0xc = local_30._12_4_;
        local_20->blocks_avail = L'\0';
        local_20->w_pos = local_6c;
        local_20->copy_pos = L'\0';
        return L'd';
      }
      if (((local_30.cache_avail < wVar3) &&
          (wVar8 = lzh_br_fillup(local_10,&local_30), wVar8 == L'\0')) &&
         (local_30.cache_avail < wVar3)) {
        if (local_14 == 0) goto LAB_00140c3d;
        local_60 = lzh_decode_huffman(hf,0);
        wVar8 = local_30.cache_avail - (uint)puVar6[local_60];
        local_30.cache_avail = wVar8;
        if (wVar8 < L'\0') goto LAB_00140c1e;
      }
      else {
        local_60 = lzh_decode_huffman(hf,0);
        local_30.cache_avail = local_30.cache_avail - (uint)puVar6[local_60];
      }
      local_5c = local_5c + L'\xffffffff';
      if (L'ÿ' < local_60) break;
      puVar5[local_6c] = (uchar)local_60;
      local_6c = local_6c + L'\x01';
      if (wVar2 <= local_6c) {
        local_6c = L'\0';
        local_20->w_remaining = wVar2;
        wVar8 = lzh_copy_from_window
                          (in_stack_ffffffffffffff68,
                           (lzh_dec *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
        ;
        if (wVar8 == L'\0') goto LAB_00140c3d;
      }
    }
    local_64 = local_60 + L'\xffffff03';
    break;
  case (huffman_conflict *)0x2:
    goto switchD_0014065c_caseD_2;
  case (huffman_conflict *)0x3:
    goto switchD_0014065c_caseD_3;
  default:
    goto switchD_0014065c_default;
  }
  if (((local_30.cache_avail < wVar4) && (wVar8 = lzh_br_fillup(local_10,&local_30), wVar8 == L'\0')
      ) && (local_30.cache_avail < wVar4)) {
    if (local_14 == 0) {
      local_80 = L'\n';
      local_20->copy_len = local_64;
      goto LAB_00140c3d;
    }
    local_68 = lzh_decode_huffman(hf,0);
    wVar8 = local_30.cache_avail - (uint)puVar7[local_68];
    local_30.cache_avail = wVar8;
    if (wVar8 < L'\0') goto LAB_00140c1e;
  }
  else {
    local_68 = lzh_decode_huffman(hf,0);
    local_30.cache_avail = local_30.cache_avail - (uint)puVar7[local_68];
  }
switchD_0014065c_caseD_2:
  if (L'\x01' < local_68) {
    wVar8 = local_68 + L'\xffffffff';
    if (((local_30.cache_avail < wVar8) &&
        (wVar9 = lzh_br_fillup(local_10,&local_30), wVar9 == L'\0')) &&
       (local_30.cache_avail < wVar8)) {
      if (local_14 != 0) {
LAB_00140c1e:
        local_20->error = L'\xffffffe7';
        return L'\xffffffe7';
      }
      local_80 = L'\v';
      local_20->copy_len = local_64;
      local_20->copy_pos = local_68;
      goto LAB_00140c3d;
    }
    local_68 = (1 << ((byte)wVar8 & 0x1f)) +
               ((uint)(local_30.cache_buffer >> ((char)local_30.cache_avail - (byte)wVar8 & 0x3f)) &
                0xffff & (uint)cache_masks[wVar8]);
    local_30.cache_avail = local_30.cache_avail - wVar8;
  }
  local_68 = (local_6c - local_68) - 1U & wVar1;
switchD_0014065c_caseD_3:
  while( true ) {
    local_88 = local_64;
    if (local_6c < local_68) {
      if (wVar2 - local_68 < local_64) {
        local_88 = wVar2 - local_68;
      }
    }
    else if (wVar2 - local_6c < local_64) {
      local_88 = wVar2 - local_6c;
    }
    if ((local_68 + local_88 < local_6c) || (local_6c + local_88 < local_68)) {
      memcpy(puVar5 + local_6c,puVar5 + local_68,(long)local_88);
    }
    else {
      in_stack_ffffffffffffff68 = (lzh_stream *)(puVar5 + local_6c);
      for (in_stack_ffffffffffffff64 = L'\0'; in_stack_ffffffffffffff64 < local_88;
          in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + L'\x01') {
        *(uchar *)((long)&in_stack_ffffffffffffff68->next_in + (long)in_stack_ffffffffffffff64) =
             puVar5[(long)in_stack_ffffffffffffff64 + (long)local_68];
      }
    }
    local_6c = local_6c + local_88 & wVar1;
    if (local_6c == L'\0') {
      local_20->w_remaining = wVar2;
      wVar8 = lzh_copy_from_window
                        (in_stack_ffffffffffffff68,
                         (lzh_dec *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (wVar8 == L'\0') {
        if (local_88 < local_64) {
          local_80 = L'\f';
          local_20->copy_len = local_64 - local_88;
          local_20->copy_pos = local_68 + local_88 & wVar1;
        }
        else {
          local_80 = L'\t';
        }
        goto LAB_00140c3d;
      }
    }
    if (local_64 <= local_88) break;
    local_64 = local_64 - local_88;
    local_68 = local_68 + local_88 & wVar1;
  }
  local_80 = L'\t';
  goto switchD_0014065c_default;
}

Assistant:

static int
lzh_decode_blocks(struct lzh_stream *strm, int last)
{
	struct lzh_dec *ds = strm->ds;
	struct lzh_br bre = ds->br;
	struct huffman *lt = &(ds->lt);
	struct huffman *pt = &(ds->pt);
	unsigned char *w_buff = ds->w_buff;
	unsigned char *lt_bitlen = lt->bitlen;
	unsigned char *pt_bitlen = pt->bitlen;
	int blocks_avail = ds->blocks_avail, c = 0;
	int copy_len = ds->copy_len, copy_pos = ds->copy_pos;
	int w_pos = ds->w_pos, w_mask = ds->w_mask, w_size = ds->w_size;
	int lt_max_bits = lt->max_bits, pt_max_bits = pt->max_bits;
	int state = ds->state;

	if (ds->w_remaining > 0) {
		if (!lzh_copy_from_window(strm, ds))
			goto next_data;
	}
	for (;;) {
		switch (state) {
		case ST_GET_LITERAL:
			for (;;) {
				if (blocks_avail == 0) {
					/* We have decoded all blocks.
					 * Let's handle next blocks. */
					ds->state = ST_RD_BLOCK;
					ds->br = bre;
					ds->blocks_avail = 0;
					ds->w_pos = w_pos;
					ds->copy_pos = 0;
					return (100);
				}

				/* lzh_br_read_ahead() always try to fill the
				 * cache buffer up. In specific situation we
				 * are close to the end of the data, the cache
				 * buffer will not be full and thus we have to
				 * determine if the cache buffer has some bits
				 * as much as we need after lzh_br_read_ahead()
				 * failed. */
				if (!lzh_br_read_ahead(strm, &bre,
				    lt_max_bits)) {
					if (!last)
						goto next_data;
					/* Remaining bits are less than
					 * maximum bits(lt.max_bits) but maybe
					 * it still remains as much as we need,
					 * so we should try to use it with
					 * dummy bits. */
					c = lzh_decode_huffman(lt,
					      lzh_br_bits_forced(&bre,
					        lt_max_bits));
					lzh_br_consume(&bre, lt_bitlen[c]);
					if (!lzh_br_has(&bre, 0))
						goto failed;/* Over read. */
				} else {
					c = lzh_decode_huffman(lt,
					      lzh_br_bits(&bre, lt_max_bits));
					lzh_br_consume(&bre, lt_bitlen[c]);
				}
				blocks_avail--;
				if (c > UCHAR_MAX)
					/* Current block is a match data. */
					break;
				/*
				 * 'c' is exactly a literal code.
				 */
				/* Save a decoded code to reference it
				 * afterward. */
				w_buff[w_pos] = c;
				if (++w_pos >= w_size) {
					w_pos = 0;
					ds->w_remaining = w_size;
					if (!lzh_copy_from_window(strm, ds))
						goto next_data;
				}
			}
			/* 'c' is the length of a match pattern we have
			 * already extracted, which has be stored in
			 * window(ds->w_buff). */
			copy_len = c - (UCHAR_MAX + 1) + MINMATCH;
			/* FALL THROUGH */
		case ST_GET_POS_1:
			/*
			 * Get a reference position. 
			 */
			if (!lzh_br_read_ahead(strm, &bre, pt_max_bits)) {
				if (!last) {
					state = ST_GET_POS_1;
					ds->copy_len = copy_len;
					goto next_data;
				}
				copy_pos = lzh_decode_huffman(pt,
				    lzh_br_bits_forced(&bre, pt_max_bits));
				lzh_br_consume(&bre, pt_bitlen[copy_pos]);
				if (!lzh_br_has(&bre, 0))
					goto failed;/* Over read. */
			} else {
				copy_pos = lzh_decode_huffman(pt,
				    lzh_br_bits(&bre, pt_max_bits));
				lzh_br_consume(&bre, pt_bitlen[copy_pos]);
			}
			/* FALL THROUGH */
		case ST_GET_POS_2:
			if (copy_pos > 1) {
				/* We need an additional adjustment number to
				 * the position. */
				int p = copy_pos - 1;
				if (!lzh_br_read_ahead(strm, &bre, p)) {
					if (last)
						goto failed;/* Truncated data.*/
					state = ST_GET_POS_2;
					ds->copy_len = copy_len;
					ds->copy_pos = copy_pos;
					goto next_data;
				}
				copy_pos = (1 << p) + lzh_br_bits(&bre, p);
				lzh_br_consume(&bre, p);
			}
			/* The position is actually a distance from the last
			 * code we had extracted and thus we have to convert
			 * it to a position of the window. */
			copy_pos = (w_pos - copy_pos - 1) & w_mask;
			/* FALL THROUGH */
		case ST_COPY_DATA:
			/*
			 * Copy `copy_len' bytes as extracted data from
			 * the window into the output buffer.
			 */
			for (;;) {
				int l;

				l = copy_len;
				if (copy_pos > w_pos) {
					if (l > w_size - copy_pos)
						l = w_size - copy_pos;
				} else {
					if (l > w_size - w_pos)
						l = w_size - w_pos;
				}
				if ((copy_pos + l < w_pos)
				    || (w_pos + l < copy_pos)) {
					/* No overlap. */
					memcpy(w_buff + w_pos,
					    w_buff + copy_pos, l);
				} else {
					const unsigned char *s;
					unsigned char *d;
					int li;

					d = w_buff + w_pos;
					s = w_buff + copy_pos;
					for (li = 0; li < l; li++)
						d[li] = s[li];
				}
				w_pos = (w_pos + l) & w_mask;
				if (w_pos == 0) {
					ds->w_remaining = w_size;
					if (!lzh_copy_from_window(strm, ds)) {
						if (copy_len <= l)
							state = ST_GET_LITERAL;
						else {
							state = ST_COPY_DATA;
							ds->copy_len =
							    copy_len - l;
							ds->copy_pos =
							    (copy_pos + l)
							    & w_mask;
						}
						goto next_data;
					}
				}
				if (copy_len <= l)
					/* A copy of current pattern ended. */
					break;
				copy_len -= l;
				copy_pos = (copy_pos + l) & w_mask;
			}
			state = ST_GET_LITERAL;
			break;
		}
	}
failed:
	return (ds->error = ARCHIVE_FAILED);
next_data:
	ds->br = bre;
	ds->blocks_avail = blocks_avail;
	ds->state = state;
	ds->w_pos = w_pos;
	return (ARCHIVE_OK);
}